

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O1

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>::
WriteFunc<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
          (ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
           *this,BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>
                 e)

{
  long lVar1;
  char *__s;
  undefined8 *puVar2;
  size_t __n;
  ptrdiff_t _Num;
  ulong uVar3;
  char *str;
  
  lVar1 = *(long *)(this + 8);
  __s = internal::ExprInfo::INFO
        [*(uint *)e.super_BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>.super_ExprBase.impl_].
        str;
  __n = strlen(__s);
  puVar2 = *(undefined8 **)(lVar1 + 8);
  uVar3 = puVar2[2] + __n;
  if ((ulong)puVar2[3] < uVar3) {
    (**(code **)*puVar2)(puVar2,uVar3);
  }
  if (__n != 0) {
    memmove((void *)(puVar2[1] + puVar2[2]),__s,__n);
  }
  puVar2[2] = uVar3;
  WriteArgs<mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>>
            (this,(Impl **)((long)e.super_BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>.
                                  super_ExprBase.impl_ + 8),
             (Impl **)((long)e.super_BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>.
                             super_ExprBase.impl_ +
                       (long)*(int *)((long)e.
                                            super_BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>.
                                            super_ExprBase.impl_ + 4) * 8 + 8),", ",0);
  return;
}

Assistant:

void WriteFunc(Expr e) {
    writer_ << str(e.kind());
    WriteArgs(e);
  }